

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingScanPartial<unsigned_short,short,unsigned_short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint16_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  unsigned_short uVar3;
  data_ptr_t pdVar4;
  BitpackingScanState<unsigned_short,_short> *this;
  idx_t iVar5;
  long lVar6;
  idx_t remaining;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  idx_t size;
  
  this = (BitpackingScanState<unsigned_short,_short> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  for (uVar8 = 0; uVar7 = scan_count - uVar8, uVar8 <= scan_count && uVar7 != 0;
      uVar8 = uVar8 + size) {
    iVar5 = this->current_group_offset;
    if (iVar5 == 0x800) {
      BitpackingScanState<unsigned_short,_short>::LoadNextGroup(this);
      iVar5 = this->current_group_offset;
    }
    BVar1 = (this->current_group).mode;
    if (BVar1 == CONSTANT_DELTA) {
      size = 0x800 - iVar5;
      if (uVar7 < 0x800 - iVar5) {
        size = uVar7;
      }
      for (uVar7 = 0; size != uVar7; uVar7 = uVar7 + 1) {
        *(unsigned_short *)(pdVar4 + uVar7 * 2 + uVar8 * 2 + result_offset * 2) =
             ((short)iVar5 + (short)uVar7) * this->current_constant +
             this->current_frame_of_reference;
      }
    }
    else if (BVar1 == CONSTANT) {
      uVar3 = this->current_constant;
      for (lVar6 = uVar8 * 2; scan_count * 2 != lVar6; lVar6 = lVar6 + 2) {
        *(unsigned_short *)(pdVar4 + lVar6 + result_offset * 2) = uVar3;
      }
      size = 0x800 - iVar5;
      if (uVar7 < 0x800 - iVar5) {
        size = uVar7;
      }
    }
    else {
      uVar9 = (uint)iVar5 & 0x1f;
      size = 0x20 - (ulong)uVar9;
      if (uVar7 < size) {
        size = uVar7;
      }
      bVar2 = this->current_width;
      out = (uint16_t *)(pdVar4 + uVar8 * 2 + result_offset * 2);
      if (size == 0x20) {
        duckdb_fastpforlib::fastunpack
                  ((uint16_t *)
                   (this->current_group_ptr + ((bVar2 * iVar5 >> 3) - (ulong)(uVar9 * bVar2 >> 3))),
                   out,(uint)bVar2);
      }
      else {
        duckdb_fastpforlib::fastunpack
                  ((uint16_t *)
                   (this->current_group_ptr + ((bVar2 * iVar5 >> 3) - (ulong)(uVar9 * bVar2 >> 3))),
                   this->decompression_buffer,(uint)bVar2);
        switchD_0193dc74::default(out,this->decompression_buffer + uVar9,size * 2);
      }
      uVar3 = this->current_frame_of_reference;
      if ((this->current_group).mode == DELTA_FOR) {
        ApplyFrameOfReference<short>((short *)out,uVar3,size);
        DeltaDecode<short>((short *)out,this->current_delta_offset,size);
        this->current_delta_offset = out[size - 1];
      }
      else if (uVar3 != 0) {
        for (iVar5 = 0; size != iVar5; iVar5 = iVar5 + 1) {
          out[iVar5] = out[iVar5] + uVar3;
        }
      }
      iVar5 = this->current_group_offset;
    }
    this->current_group_offset = iVar5 + size;
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}